

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_mgc2mgc(HTS_Vocoder *v,double *c1,int m1,double a1,double g1,double *c2,int m2,double a2,
                double g2)

{
  double in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  double *in_RDI;
  undefined4 in_R8D;
  HTS_Vocoder *in_XMM0_Qa;
  double *in_XMM1_Qa;
  double *in_XMM2_Qa;
  double *in_XMM3_Qa;
  HTS_Vocoder *unaff_retaddr;
  double a;
  double in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffc8;
  int m2_00;
  undefined4 in_stack_ffffffffffffffe8;
  int m1_00;
  
  m1_00 = (int)((ulong)in_RSI >> 0x20);
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (((double)in_XMM0_Qa != (double)in_XMM2_Qa) ||
     (NAN((double)in_XMM0_Qa) || NAN((double)in_XMM2_Qa))) {
    iVar1 = (int)((ulong)(((double)in_XMM2_Qa - (double)in_XMM0_Qa) /
                         (-(double)in_XMM0_Qa * (double)in_XMM2_Qa + 1.0)) >> 0x20);
    HTS_freqt(in_XMM0_Qa,in_XMM1_Qa,(int)((ulong)in_RCX >> 0x20),
              (double *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),(int)((ulong)in_XMM2_Qa >> 0x20),
              (double)in_XMM3_Qa);
    m2_00 = (int)((ulong)in_XMM1_Qa >> 0x20);
    HTS_gnorm(in_XMM2_Qa,in_XMM3_Qa,iVar1,in_stack_ffffffffffffffa8);
    HTS_gc2gc(unaff_retaddr,in_RDI,m1_00,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
              (double *)in_XMM0_Qa,m2_00,in_RCX);
    HTS_ignorm(in_XMM2_Qa,in_XMM3_Qa,iVar1,in_stack_ffffffffffffffa8);
  }
  else {
    HTS_gnorm(in_XMM2_Qa,in_XMM3_Qa,iVar1,in_stack_ffffffffffffffa8);
    HTS_gc2gc(unaff_retaddr,in_RDI,m1_00,(double)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
              (double *)in_XMM0_Qa,(int)((ulong)in_XMM1_Qa >> 0x20),in_RCX);
    HTS_ignorm(in_XMM2_Qa,in_XMM3_Qa,iVar1,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void HTS_mgc2mgc(HTS_Vocoder * v, double *c1, const int m1, const double a1, const double g1, double *c2, const int m2, const double a2, const double g2)
{
   double a;

   if (a1 == a2) {
      HTS_gnorm(c1, c1, m1, g1);
      HTS_gc2gc(v, c1, m1, g1, c2, m2, g2);
      HTS_ignorm(c2, c2, m2, g2);
   } else {
      a = (a2 - a1) / (1 - a1 * a2);
      HTS_freqt(v, c1, m1, c2, m2, a);
      HTS_gnorm(c2, c2, m2, g1);
      HTS_gc2gc(v, c2, m2, g1, c2, m2, g2);
      HTS_ignorm(c2, c2, m2, g2);
   }
}